

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O1

bool __thiscall
spvtools::val::anon_unknown_0::hasDecoration
          (anon_unknown_0 *this,uint32_t id,Decoration decoration,ValidationState_t *vstate)

{
  void *pvVar1;
  bool bVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  Instruction *pIVar5;
  undefined7 uVar6;
  undefined4 in_register_00000014;
  uint32_t id_00;
  uint *puVar7;
  undefined1 uVar8;
  bool bVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  uVar6 = (undefined7)((ulong)vstate >> 8);
  id_00 = (uint32_t)this;
  local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = id_00;
  pmVar3 = std::
           map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
           ::operator[](&((ValidationState_t *)CONCAT44(in_register_00000014,decoration))->
                         id_decorations_,(key_type_conflict *)&local_40);
  for (p_Var4 = (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      uVar8 = (_Rb_tree_header *)p_Var4 == &(pmVar3->_M_t)._M_impl.super__Rb_tree_header,
      !(bool)uVar8; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    if (p_Var4[1]._M_color == id) {
      if (!(bool)uVar8) {
        return true;
      }
      break;
    }
  }
  pIVar5 = ValidationState_t::FindDef
                     ((ValidationState_t *)CONCAT44(in_register_00000014,decoration),id_00);
  if ((pIVar5->inst_).opcode == 0x1e) {
    getStructMembers(&local_40,id_00,decoration,(ValidationState_t *)CONCAT71(uVar6,uVar8));
    puVar7 = (uint *)CONCAT44(local_40.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint32_t)
                              local_40.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    bVar9 = puVar7 != local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
    if (bVar9) {
      bVar2 = hasDecoration((anon_unknown_0 *)(ulong)*puVar7,id,decoration,
                            (ValidationState_t *)CONCAT71(uVar6,uVar8));
      while (!bVar2) {
        puVar7 = puVar7 + 1;
        bVar9 = puVar7 != local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
        if (puVar7 == local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish) break;
        bVar2 = hasDecoration((anon_unknown_0 *)(ulong)*puVar7,id,decoration,
                              (ValidationState_t *)CONCAT71(uVar6,uVar8));
      }
    }
    pvVar1 = (void *)CONCAT44(local_40.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint32_t)
                              local_40.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_40.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1)
      ;
    }
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool hasDecoration(uint32_t id, spv::Decoration decoration,
                   ValidationState_t& vstate) {
  for (auto& dec : vstate.id_decorations(id)) {
    if (decoration == dec.dec_type()) return true;
  }
  if (spv::Op::OpTypeStruct != vstate.FindDef(id)->opcode()) {
    return false;
  }
  for (auto member_id : getStructMembers(id, spv::Op::OpTypeStruct, vstate)) {
    if (hasDecoration(member_id, decoration, vstate)) {
      return true;
    }
  }
  return false;
}